

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O0

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromName(CSceneManager *this,char *name,ISceneNode *start)

{
  bool bVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_const_char_*> _Var2;
  reference ppIVar3;
  ISceneNode *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  const_iterator it;
  ISceneNodeList *list;
  ISceneNode *node;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  startName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff80;
  undefined8 uVar4;
  _Self local_70;
  _Self local_68;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *local_60;
  ISceneNode *local_58;
  undefined4 local_4c;
  ISceneNode *local_20;
  undefined8 local_18;
  ISceneNode *local_8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (in_RDX == (ISceneNode *)0x0) {
    local_20 = (ISceneNode *)(**(code **)(*in_RDI + 0x48))();
  }
  (*local_20->_vptr_ISceneNode[5])();
  ::std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  bVar1 = ::std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2fbaba);
  if ((bVar1) &&
     (_Var2 = ::std::operator==(in_stack_ffffffffffffff80,(char **)in_stack_ffffffffffffff78), _Var2
     )) {
    local_8 = local_20;
  }
  else {
    local_58 = (ISceneNode *)0x0;
    local_60 = ISceneNode::getChildren_abi_cxx11_(local_20);
    local_68._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::
         begin((list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
               in_stack_ffffffffffffff78);
    while( true ) {
      local_70._M_node =
           (_List_node_base *)
           ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
           ::end((list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
                 in_stack_ffffffffffffff78);
      bVar1 = ::std::operator!=(&local_68,&local_70);
      if (!bVar1) break;
      uVar4 = local_18;
      ppIVar3 = ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator*
                          ((_List_const_iterator<irr::scene::ISceneNode_*> *)0x2fbb4e);
      local_58 = (ISceneNode *)(**(code **)(*in_RDI + 0x58))(in_RDI,uVar4,*ppIVar3);
      local_8 = local_58;
      if (local_58 != (ISceneNode *)0x0) goto LAB_002fbba7;
      ::std::_List_const_iterator<irr::scene::ISceneNode_*>::operator++(&local_68);
    }
    local_8 = (ISceneNode *)0x0;
  }
LAB_002fbba7:
  local_4c = 1;
  ::std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x2fbbb1);
  return local_8;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromName(const char *name, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	auto startName = start->getName();
	if (startName.has_value() && startName == name)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromName(name, *it);
		if (node)
			return node;
	}

	return 0;
}